

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O1

int zoh_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  uint uVar1;
  void *pvVar2;
  float *pfVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double local_50;
  undefined8 uStack_30;
  
  lVar7 = data->input_frames;
  if (lVar7 < 1) {
    return 0;
  }
  pvVar2 = psrc->private_data;
  if (pvVar2 == (void *)0x0) {
    iVar6 = 5;
  }
  else {
    if (*(int *)((long)pvVar2 + 8) != 0) {
      iVar6 = *(int *)((long)pvVar2 + 4);
      if (0 < (long)iVar6) {
        pfVar3 = data->data_in;
        lVar9 = 0;
        do {
          *(float *)((long)pvVar2 + lVar9 * 4 + 0x30) = pfVar3[lVar9];
          lVar9 = lVar9 + 1;
        } while (iVar6 != lVar9);
      }
      *(undefined4 *)((long)pvVar2 + 8) = 0;
    }
    uVar1 = *(uint *)((long)pvVar2 + 4);
    lVar7 = lVar7 * (int)uVar1;
    *(long *)((long)pvVar2 + 0x10) = lVar7;
    lVar9 = data->output_frames * (long)(int)uVar1;
    *(long *)((long)pvVar2 + 0x20) = lVar9;
    *(undefined8 *)((long)pvVar2 + 0x28) = 0;
    *(undefined8 *)((long)pvVar2 + 0x18) = 0;
    dVar12 = psrc->last_ratio;
    iVar6 = 0x16;
    if ((0.00390625 <= dVar12) && (dVar12 <= 256.0)) {
      dVar14 = psrc->last_position;
      local_50 = dVar12;
      if (dVar14 < 1.0) {
        lVar8 = *(long *)((long)pvVar2 + 0x28);
        do {
          if ((lVar9 <= lVar8) || ((double)lVar7 <= (double)(int)uVar1 * dVar14 + 0.0)) break;
          if ((0 < lVar9) && (1e-20 < ABS(dVar12 - data->src_ratio))) {
            local_50 = ((data->src_ratio - dVar12) * (double)lVar8) / (double)lVar9 + dVar12;
          }
          if (0 < (int)uVar1) {
            pfVar3 = data->data_out;
            uVar10 = 0;
            do {
              pfVar3[lVar8 + uVar10] = *(float *)((long)pvVar2 + uVar10 * 4 + 0x30);
              uVar10 = uVar10 + 1;
            } while (uVar1 != uVar10);
            lVar8 = lVar8 + uVar10;
            *(long *)((long)pvVar2 + 0x28) = lVar8;
          }
          dVar14 = dVar14 + 1.0 / local_50;
        } while (dVar14 < 1.0);
      }
      lVar7 = lrint(dVar14);
      dVar12 = dVar14 - (double)lVar7;
      dVar12 = (double)(~-(ulong)(dVar12 < 0.0) & (ulong)dVar12 |
                       (ulong)(dVar12 + 1.0) & -(ulong)(dVar12 < 0.0));
      iVar6 = *(int *)((long)pvVar2 + 4);
      lVar7 = lrint(dVar14 - dVar12);
      lVar8 = lVar7 * iVar6 + *(long *)((long)pvVar2 + 0x18);
      *(long *)((long)pvVar2 + 0x18) = lVar8;
      lVar7 = *(long *)((long)pvVar2 + 0x20);
      lVar9 = *(long *)((long)pvVar2 + 0x28);
      if (lVar9 < lVar7) {
        uStack_30 = 0;
        do {
          uVar1 = *(uint *)((long)pvVar2 + 4);
          if ((double)*(long *)((long)pvVar2 + 0x10) < (double)(int)uVar1 * dVar12 + (double)lVar8)
          break;
          if (0 < lVar7) {
            dVar14 = psrc->last_ratio;
            if (1e-20 < ABS(dVar14 - data->src_ratio)) {
              local_50 = ((data->src_ratio - dVar14) * (double)lVar9) / (double)lVar7 + dVar14;
            }
          }
          if (0 < (int)uVar1) {
            pfVar3 = data->data_out;
            lVar7 = *(long *)((long)pvVar2 + 0x28);
            pfVar4 = data->data_in;
            lVar9 = -(ulong)uVar1;
            do {
              pfVar3[lVar7] = pfVar4[lVar8 + lVar9];
              lVar7 = lVar7 + 1;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0);
            *(long *)((long)pvVar2 + 0x28) = lVar7;
          }
          dVar14 = dVar12 + 1.0 / local_50;
          lVar7 = lrint(dVar14);
          dVar12 = dVar14 - (double)lVar7;
          auVar13._0_8_ = ~-(ulong)(dVar12 < 0.0) & (ulong)dVar12;
          auVar13._8_8_ = 0;
          auVar5._8_4_ = (int)uStack_30;
          auVar5._0_8_ = (ulong)(dVar12 + 1.0) & -(ulong)(dVar12 < 0.0);
          auVar5._12_4_ = (int)((ulong)uStack_30 >> 0x20);
          iVar6 = *(int *)((long)pvVar2 + 4);
          dVar12 = SUB168(auVar13 | auVar5,0);
          lVar7 = lrint(dVar14 - dVar12);
          uStack_30 = SUB168(auVar13 | auVar5,8);
          lVar8 = lVar7 * iVar6 + *(long *)((long)pvVar2 + 0x18);
          *(long *)((long)pvVar2 + 0x18) = lVar8;
          lVar7 = *(long *)((long)pvVar2 + 0x20);
          lVar9 = *(long *)((long)pvVar2 + 0x28);
        } while (lVar9 < lVar7);
      }
      lVar7 = *(long *)((long)pvVar2 + 0x10);
      if (lVar8 - lVar7 != 0 && lVar7 <= lVar8) {
        dVar12 = dVar12 + (double)((lVar8 - lVar7) / (long)*(int *)((long)pvVar2 + 4));
        *(long *)((long)pvVar2 + 0x18) = lVar7;
      }
      psrc->last_position = dVar12;
      lVar7 = *(long *)((long)pvVar2 + 0x18);
      if ((0 < lVar7) && (lVar8 = (long)*(int *)((long)pvVar2 + 4), 0 < lVar8)) {
        pfVar3 = data->data_in;
        lVar11 = 0;
        do {
          *(float *)((long)pvVar2 + lVar11 * 4 + 0x30) = pfVar3[(lVar7 - lVar8) + lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar8 != lVar11);
      }
      psrc->last_ratio = local_50;
      iVar6 = *(int *)((long)pvVar2 + 4);
      data->input_frames_used = lVar7 / (long)iVar6;
      data->output_frames_gen = lVar9 / (long)iVar6;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int
zoh_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	ZOH_DATA 	*priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (ZOH_DATA*) psrc->private_data ;

	if (priv->reset)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->reset = 0 ;
		} ;

	priv->in_count = data->input_frames * priv->channels ;
	priv->out_count = data->output_frames * priv->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = psrc->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + priv->channels * input_index >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = priv->last_value [ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += priv->channels * lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + priv->channels * input_index <= priv->in_count)
	{
		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = data->data_in [priv->in_used - priv->channels + ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += priv->channels * lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / priv->channels ;
		priv->in_used = priv->in_count ;
		} ;

	psrc->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - priv->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / priv->channels ;
	data->output_frames_gen = priv->out_gen / priv->channels ;

	return SRC_ERR_NO_ERROR ;
}